

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineComputer.cxx
# Opt level: O0

void __thiscall
cmLinkLineComputer::cmLinkLineComputer
          (cmLinkLineComputer *this,cmOutputConverter *outputConverter,cmStateDirectory *stateDir)

{
  cmStateDirectory *stateDir_local;
  cmOutputConverter *outputConverter_local;
  cmLinkLineComputer *this_local;
  
  this->_vptr_cmLinkLineComputer = (_func_int **)&PTR__cmLinkLineComputer_00fea380;
  memcpy(&this->StateDir,stateDir,0x28);
  this->OutputConverter = outputConverter;
  this->ForResponse = false;
  this->UseWatcomQuote = false;
  this->UseNinjaMulti = false;
  this->Relink = false;
  return;
}

Assistant:

cmLinkLineComputer::cmLinkLineComputer(cmOutputConverter* outputConverter,
                                       cmStateDirectory const& stateDir)
  : StateDir(stateDir)
  , OutputConverter(outputConverter)
{
}